

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mipsdsp_add_cmp_pick
               (DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2,
               int check_ret)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 v2_t;
  TCGv_i64 v1_t;
  TCGv_i64 t1;
  TCGContext_conflict6 *tcg_ctx;
  int v2_local;
  int v1_local;
  int ret_local;
  uint32_t op2_local;
  uint32_t op1_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ret != 0) || (check_ret != 1)) {
    retval = tcg_temp_new_i64(tcg_ctx_00);
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,v1);
    gen_load_gpr(tcg_ctx_00,t_00,v2);
    if (op1 == 0x7c000011) {
      if (op2 == 0x7c000011) {
        check_dsp(ctx);
        gen_helper_cmpu_eq_qb(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000051) {
        check_dsp(ctx);
        gen_helper_cmpu_lt_qb(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000091) {
        check_dsp(ctx);
        gen_helper_cmpu_le_qb(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000d1) {
        check_dsp(ctx);
        gen_helper_pick_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000111) {
        check_dsp(ctx);
        gen_helper_cmpgu_eq_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000151) {
        check_dsp(ctx);
        gen_helper_cmpgu_lt_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000191) {
        check_dsp(ctx);
        gen_helper_cmpgu_le_qb(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000211) {
        check_dsp(ctx);
        gen_helper_cmp_eq_ph(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000251) {
        check_dsp(ctx);
        gen_helper_cmp_lt_ph(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000291) {
        check_dsp(ctx);
        gen_helper_cmp_le_ph(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002d1) {
        check_dsp(ctx);
        gen_helper_pick_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000391) {
        check_dsp(ctx);
        gen_helper_packrl_ph(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000611) {
        check_dsp_r2(ctx);
        gen_helper_cmpgu_eq_qb(tcg_ctx_00,retval,t,t_00);
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],retval);
        tcg_gen_andi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,0xf0ffffff);
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,retval,retval,0x18);
        tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,retval);
      }
      else if (op2 == 0x7c000651) {
        check_dsp_r2(ctx);
        gen_helper_cmpgu_lt_qb(tcg_ctx_00,retval,t,t_00);
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],retval);
        tcg_gen_andi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,0xf0ffffff);
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,retval,retval,0x18);
        tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,retval);
      }
      else if (op2 == 0x7c000691) {
        check_dsp_r2(ctx);
        gen_helper_cmpgu_le_qb(tcg_ctx_00,retval,t,t_00);
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],retval);
        tcg_gen_andi_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,0xf0ffffff);
        tcg_gen_shli_i64_mips64el(tcg_ctx_00,retval,retval,0x18);
        tcg_gen_or_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_dspctrl,tcg_ctx_00->cpu_dspctrl,retval);
      }
    }
    else if (op1 == 0x7c000015) {
      if (op2 == 0x7c000015) {
        check_dsp(ctx);
        gen_helper_cmpu_eq_ob(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000055) {
        check_dsp(ctx);
        gen_helper_cmpu_lt_ob(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000095) {
        check_dsp(ctx);
        gen_helper_cmpu_le_ob(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000d5) {
        check_dsp(ctx);
        gen_helper_pick_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000115) {
        check_dsp(ctx);
        gen_helper_cmpgu_eq_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000155) {
        check_dsp(ctx);
        gen_helper_cmpgu_lt_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000195) {
        check_dsp(ctx);
        gen_helper_cmpgu_le_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000215) {
        check_dsp(ctx);
        gen_helper_cmp_eq_qh(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000255) {
        check_dsp(ctx);
        gen_helper_cmp_lt_qh(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000295) {
        check_dsp(ctx);
        gen_helper_cmp_le_qh(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002d5) {
        check_dsp(ctx);
        gen_helper_pick_qh(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000395) {
        check_dsp(ctx);
        gen_helper_packrl_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00);
      }
      else if (op2 == 0x7c000415) {
        check_dsp(ctx);
        gen_helper_cmp_eq_pw(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000455) {
        check_dsp(ctx);
        gen_helper_cmp_lt_pw(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000495) {
        check_dsp(ctx);
        gen_helper_cmp_le_pw(tcg_ctx_00,t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004d5) {
        check_dsp(ctx);
        gen_helper_pick_pw(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000615) {
        check_dsp_r2(ctx);
        gen_helper_cmpgdu_eq_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000655) {
        check_dsp_r2(ctx);
        gen_helper_cmpgdu_lt_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000695) {
        check_dsp_r2(ctx);
        gen_helper_cmpgdu_le_ob(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],t,t_00,tcg_ctx_00->cpu_env);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,retval);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_mipsdsp_add_cmp_pick(DisasContext *ctx,
                                     uint32_t op1, uint32_t op2,
                                     int ret, int v1, int v2, int check_ret)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_CMPU_EQ_QB_DSP:
        switch (op2) {
        case OPC_CMPU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpu_le_qb(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_QB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGDU_EQ_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_eq_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LT_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_lt_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMPGDU_LE_QB:
            check_dsp_r2(ctx);
            gen_helper_cmpgu_le_qb(tcg_ctx, t1, v1_t, v2_t);
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[ret], t1);
            tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, 0xF0FFFFFF);
            tcg_gen_shli_tl(tcg_ctx, t1, t1, 24);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_dspctrl, tcg_ctx->cpu_dspctrl, t1);
            break;
        case OPC_CMP_EQ_PH:
            check_dsp(ctx);
            gen_helper_cmp_eq_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PH:
            check_dsp(ctx);
            gen_helper_cmp_lt_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PH:
            check_dsp(ctx);
            gen_helper_cmp_le_ph(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QB:
            check_dsp(ctx);
            gen_helper_pick_qb(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PH:
            check_dsp(ctx);
            gen_helper_pick_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PH:
            check_dsp(ctx);
            gen_helper_packrl_ph(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_CMPU_EQ_OB_DSP:
        switch (op2) {
        case OPC_CMP_EQ_PW:
            check_dsp(ctx);
            gen_helper_cmp_eq_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_PW:
            check_dsp(ctx);
            gen_helper_cmp_lt_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_PW:
            check_dsp(ctx);
            gen_helper_cmp_le_pw(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_EQ_QH:
            check_dsp(ctx);
            gen_helper_cmp_eq_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LT_QH:
            check_dsp(ctx);
            gen_helper_cmp_lt_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMP_LE_QH:
            check_dsp(ctx);
            gen_helper_cmp_le_qh(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_EQ_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LT_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGDU_LE_OB:
            check_dsp_r2(ctx);
            gen_helper_cmpgdu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPGU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_eq_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_lt_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPGU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpgu_le_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_CMPU_EQ_OB:
            check_dsp(ctx);
            gen_helper_cmpu_eq_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LT_OB:
            check_dsp(ctx);
            gen_helper_cmpu_lt_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_CMPU_LE_OB:
            check_dsp(ctx);
            gen_helper_cmpu_le_ob(tcg_ctx, v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PACKRL_PW:
            check_dsp(ctx);
            gen_helper_packrl_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t);
            break;
        case OPC_PICK_OB:
            check_dsp(ctx);
            gen_helper_pick_ob(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_PW:
            check_dsp(ctx);
            gen_helper_pick_pw(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        case OPC_PICK_QH:
            check_dsp(ctx);
            gen_helper_pick_qh(tcg_ctx, tcg_ctx->cpu_gpr[ret], v1_t, v2_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}